

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O0

int wally_scriptpubkey_csv_2of2_then_1_from_bytes_opt
              (uchar *bytes,size_t bytes_len,uint32_t csv_blocks,uint32_t flags,uchar *bytes_out,
              size_t len,size_t *written)

{
  size_t sVar1;
  ulong uVar2;
  uchar *bytes_out_00;
  size_t script_len;
  size_t csv_len;
  size_t len_local;
  uchar *bytes_out_local;
  uint32_t flags_local;
  uint32_t csv_blocks_local;
  size_t bytes_len_local;
  uchar *bytes_local;
  
  sVar1 = scriptint_get_length((ulong)csv_blocks);
  uVar2 = sVar1 + 0x4b;
  if (written != (size_t *)0x0) {
    *written = 0;
  }
  if ((((bytes == (uchar *)0x0) || (bytes_len != 0x42)) || (csv_blocks < 0x11)) ||
     (((0xffff < csv_blocks || (flags != 0)) ||
      ((bytes_out == (uchar *)0x0 || (written == (size_t *)0x0)))))) {
    bytes_local._4_4_ = -2;
  }
  else if (len < uVar2) {
    *written = uVar2;
    bytes_local._4_4_ = 0;
  }
  else {
    *bytes_out = '!';
    memcpy(bytes_out + 1,bytes + 0x21,0x21);
    bytes_out[0x22] = 0xad;
    bytes_out[0x23] = '!';
    memcpy(bytes_out + 0x24,bytes,0x21);
    bytes_out[0x45] = 0xac;
    bytes_out[0x46] = 's';
    bytes_out[0x47] = 'd';
    bytes_out_00 = bytes_out + 0x49;
    bytes_out[0x48] = (uchar)sVar1;
    sVar1 = scriptint_to_bytes((ulong)csv_blocks,bytes_out_00);
    bytes_out_00[sVar1] = 0xb2;
    (bytes_out_00 + sVar1)[1] = 'h';
    *written = uVar2;
    bytes_local._4_4_ = 0;
  }
  return bytes_local._4_4_;
}

Assistant:

int wally_scriptpubkey_csv_2of2_then_1_from_bytes_opt(
    const unsigned char *bytes, size_t bytes_len, uint32_t csv_blocks,
    uint32_t flags, unsigned char *bytes_out, size_t len, size_t *written)
{
    size_t csv_len = scriptint_get_length(csv_blocks);
    size_t script_len = 2 * (EC_PUBLIC_KEY_LEN + 1) + 6 + 1 + csv_len; /* 1 for push */

    if (written)
        *written = 0;

    if (!bytes || bytes_len != 2 * EC_PUBLIC_KEY_LEN ||
        csv_blocks < 17 || csv_blocks > 0xffff || flags || !bytes_out || !written)
        return WALLY_EINVAL;

    if (len < script_len) {
        *written = script_len;
        return WALLY_OK;
    }

    /* The script we create is:
     *     <recovery_pubkey> OP_CHECKSIGVERIFY
     *     <main_pubkey> OP_CHECKSIG OP_IFDUP OP_NOTIF
     *         <CSV_BLOCK> OP_CHECKSEQUENCEVERIFY
     * OP_ENDIF
     * Solved by:
     * 1) The stack containing the main and and recovery signatures.
     * 2) The stack containing an empty signature and the recovery signature.
     */
    *bytes_out++ = EC_PUBLIC_KEY_LEN;
    memcpy(bytes_out, bytes + EC_PUBLIC_KEY_LEN, EC_PUBLIC_KEY_LEN);
    bytes_out += EC_PUBLIC_KEY_LEN;
    *bytes_out++ = OP_CHECKSIGVERIFY;
    *bytes_out++ = EC_PUBLIC_KEY_LEN;
    memcpy(bytes_out, bytes, EC_PUBLIC_KEY_LEN);
    bytes_out += EC_PUBLIC_KEY_LEN;
    *bytes_out++ = OP_CHECKSIG;
    *bytes_out++ = OP_IFDUP;
    *bytes_out++ = OP_NOTIF;
    *bytes_out++ = csv_len & 0xff;
    bytes_out += scriptint_to_bytes(csv_blocks, bytes_out);
    *bytes_out++ = OP_CHECKSEQUENCEVERIFY;
    *bytes_out++ = OP_ENDIF;

    *written = script_len;
    return WALLY_OK;
}